

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::closeOver(UnicodeSet *this,int32_t attribute)

{
  undefined4 uVar1;
  UBool UVar2;
  UChar32 UVar3;
  int32_t iVar4;
  UnicodeString *pUVar5;
  char16_t *s;
  BreakIterator *iter;
  UnicodeString *pUVar6;
  int32_t local_21c;
  int32_t j_1;
  UnicodeString *pStr;
  BreakIterator *bi;
  undefined1 local_200 [4];
  UErrorCode status;
  Locale root;
  int32_t j;
  UChar32 cp_1;
  UChar32 cp;
  UChar32 end;
  UChar32 start;
  int32_t i;
  UChar *full;
  UChar32 result;
  int32_t n;
  USetAdder sa;
  undefined1 local_b8 [8];
  UnicodeString str;
  UnicodeSet foldSet;
  int32_t attribute_local;
  UnicodeSet *this_local;
  
  UVar2 = isFrozen(this);
  if (((UVar2 == '\0') && (UVar2 = isBogus(this), UVar2 == '\0')) && ((attribute & 6U) != 0)) {
    UnicodeSet((UnicodeSet *)((long)&str.fUnion + 0x30),this);
    UnicodeString::UnicodeString((UnicodeString *)local_b8);
    _result = toUSet((UnicodeSet *)((long)&str.fUnion + 0x30));
    sa.set = (USet *)_set_add;
    sa.add = _set_addRange;
    sa.addRange = _set_addString;
    sa.addString = (USetAddString *)0x0;
    sa.remove = (undefined1 *)0x0;
    if ((attribute & 2U) != 0) {
      UVector::removeAllElements((UVector *)foldSet.pat);
    }
    full._4_4_ = getRangeCount(this);
    for (end = 0; end < full._4_4_; end = end + 1) {
      j = getRangeStart(this,end);
      UVar3 = getRangeEnd(this,end);
      if ((attribute & 2U) == 0) {
        while (root._220_4_ = j, (int)root._220_4_ <= UVar3) {
          full._0_4_ = ucase_toFullLower_63
                                 (root._220_4_,(UCaseContextIterator *)0x0,(void *)0x0,
                                  (UChar **)&start,1);
          addCaseMapping((UnicodeSet *)((long)&str.fUnion + 0x30),(int32_t)full,_start,
                         (UnicodeString *)local_b8);
          full._0_4_ = ucase_toFullTitle_63
                                 (root._220_4_,(UCaseContextIterator *)0x0,(void *)0x0,
                                  (UChar **)&start,1);
          addCaseMapping((UnicodeSet *)((long)&str.fUnion + 0x30),(int32_t)full,_start,
                         (UnicodeString *)local_b8);
          full._0_4_ = ucase_toFullUpper_63
                                 (root._220_4_,(UCaseContextIterator *)0x0,(void *)0x0,
                                  (UChar **)&start,1);
          addCaseMapping((UnicodeSet *)((long)&str.fUnion + 0x30),(int32_t)full,_start,
                         (UnicodeString *)local_b8);
          full._0_4_ = ucase_toFullFolding_63(root._220_4_,(UChar **)&start,0);
          addCaseMapping((UnicodeSet *)((long)&str.fUnion + 0x30),(int32_t)full,_start,
                         (UnicodeString *)local_b8);
          j = root._220_4_ + 1;
        }
      }
      else {
        for (; j <= UVar3; j = j + 1) {
          ucase_addCaseClosure_63(j,(USetAdder *)&result);
        }
      }
    }
    if ((this->strings != (UVector *)0x0) && (iVar4 = UVector::size(this->strings), 0 < iVar4)) {
      if ((attribute & 2U) == 0) {
        Locale::Locale((Locale *)local_200,"",(char *)0x0,(char *)0x0,(char *)0x0);
        bi._4_4_ = U_ZERO_ERROR;
        iter = BreakIterator::createWordInstance((Locale *)local_200,(UErrorCode *)((long)&bi + 4));
        UVar2 = ::U_SUCCESS(bi._4_4_);
        if (UVar2 != '\0') {
          for (local_21c = 0; iVar4 = UVector::size(this->strings), local_21c < iVar4;
              local_21c = local_21c + 1) {
            pUVar5 = (UnicodeString *)UVector::elementAt(this->strings,local_21c);
            pUVar6 = UnicodeString::operator=((UnicodeString *)local_b8,pUVar5);
            UnicodeString::toLower(pUVar6,(Locale *)local_200);
            add((UnicodeSet *)((long)&str.fUnion + 0x30),(UnicodeString *)local_b8);
            pUVar6 = UnicodeString::operator=((UnicodeString *)local_b8,pUVar5);
            UnicodeString::toTitle(pUVar6,iter,(Locale *)local_200);
            add((UnicodeSet *)((long)&str.fUnion + 0x30),(UnicodeString *)local_b8);
            pUVar6 = UnicodeString::operator=((UnicodeString *)local_b8,pUVar5);
            UnicodeString::toUpper(pUVar6,(Locale *)local_200);
            add((UnicodeSet *)((long)&str.fUnion + 0x30),(UnicodeString *)local_b8);
            pUVar5 = UnicodeString::operator=((UnicodeString *)local_b8,pUVar5);
            UnicodeString::foldCase(pUVar5,0);
            add((UnicodeSet *)((long)&str.fUnion + 0x30),(UnicodeString *)local_b8);
          }
        }
        if (iter != (BreakIterator *)0x0) {
          (*(iter->super_UObject)._vptr_UObject[1])();
        }
        Locale::~Locale((Locale *)local_200);
      }
      else {
        root.fIsBogus = '\0';
        root._217_3_ = 0;
        for (; uVar1 = root._216_4_, iVar4 = UVector::size(this->strings), (int)uVar1 < iVar4;
            root._216_4_ = root._216_4_ + 1) {
          pUVar5 = (UnicodeString *)UVector::elementAt(this->strings,root._216_4_);
          UnicodeString::operator=((UnicodeString *)local_b8,pUVar5);
          UnicodeString::foldCase((UnicodeString *)local_b8,0);
          s = UnicodeString::getBuffer((UnicodeString *)local_b8);
          iVar4 = UnicodeString::length((UnicodeString *)local_b8);
          UVar2 = ucase_addStringCaseClosure_63(s,iVar4,(USetAdder *)&result);
          if (UVar2 == '\0') {
            add((UnicodeSet *)((long)&str.fUnion + 0x30),(UnicodeString *)local_b8);
          }
        }
      }
    }
    operator=(this,(UnicodeSet *)((long)&str.fUnion + 0x30));
    UnicodeString::~UnicodeString((UnicodeString *)local_b8);
    ~UnicodeSet((UnicodeSet *)((long)&str.fUnion + 0x30));
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::closeOver(int32_t attribute) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    if (attribute & (USET_CASE_INSENSITIVE | USET_ADD_CASE_MAPPINGS)) {
        {
            UnicodeSet foldSet(*this);
            UnicodeString str;
            USetAdder sa = {
                foldSet.toUSet(),
                _set_add,
                _set_addRange,
                _set_addString,
                NULL, // don't need remove()
                NULL // don't need removeRange()
            };

            // start with input set to guarantee inclusion
            // USET_CASE: remove strings because the strings will actually be reduced (folded);
            //            therefore, start with no strings and add only those needed
            if (attribute & USET_CASE_INSENSITIVE) {
                foldSet.strings->removeAllElements();
            }

            int32_t n = getRangeCount();
            UChar32 result;
            const UChar *full;

            for (int32_t i=0; i<n; ++i) {
                UChar32 start = getRangeStart(i);
                UChar32 end   = getRangeEnd(i);

                if (attribute & USET_CASE_INSENSITIVE) {
                    // full case closure
                    for (UChar32 cp=start; cp<=end; ++cp) {
                        ucase_addCaseClosure(cp, &sa);
                    }
                } else {
                    // add case mappings
                    // (does not add long s for regular s, or Kelvin for k, for example)
                    for (UChar32 cp=start; cp<=end; ++cp) {
                        result = ucase_toFullLower(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullTitle(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullUpper(cp, NULL, NULL, &full, UCASE_LOC_ROOT);
                        addCaseMapping(foldSet, result, full, str);

                        result = ucase_toFullFolding(cp, &full, 0);
                        addCaseMapping(foldSet, result, full, str);
                    }
                }
            }
            if (strings != NULL && strings->size() > 0) {
                if (attribute & USET_CASE_INSENSITIVE) {
                    for (int32_t j=0; j<strings->size(); ++j) {
                        str = *(const UnicodeString *) strings->elementAt(j);
                        str.foldCase();
                        if(!ucase_addStringCaseClosure(str.getBuffer(), str.length(), &sa)) {
                            foldSet.add(str); // does not map to code points: add the folded string itself
                        }
                    }
                } else {
                    Locale root("");
#if !UCONFIG_NO_BREAK_ITERATION
                    UErrorCode status = U_ZERO_ERROR;
                    BreakIterator *bi = BreakIterator::createWordInstance(root, status);
                    if (U_SUCCESS(status)) {
#endif
                        const UnicodeString *pStr;

                        for (int32_t j=0; j<strings->size(); ++j) {
                            pStr = (const UnicodeString *) strings->elementAt(j);
                            (str = *pStr).toLower(root);
                            foldSet.add(str);
#if !UCONFIG_NO_BREAK_ITERATION
                            (str = *pStr).toTitle(bi, root);
                            foldSet.add(str);
#endif
                            (str = *pStr).toUpper(root);
                            foldSet.add(str);
                            (str = *pStr).foldCase();
                            foldSet.add(str);
                        }
#if !UCONFIG_NO_BREAK_ITERATION
                    }
                    delete bi;
#endif
                }
            }
            *this = foldSet;
        }
    }
    return *this;
}